

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test11(char *infile,char *password,char *outfile,char *xarg)

{
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  qpdf_read(qpdf,infile,password);
  qpdf_init_write(qpdf,outfile);
  qpdf_set_static_ID(qpdf,1);
  qpdf_set_r2_encryption_parameters_insecure(qpdf,"user1","owner1",0,1,1,1);
  qpdf_write(qpdf);
  report_errors();
  return;
}

Assistant:

static void
test11(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_read(qpdf, infile, password);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_r2_encryption_parameters_insecure(
        qpdf, "user1", "owner1", QPDF_FALSE, QPDF_TRUE, QPDF_TRUE, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}